

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_robust_access_pass.cpp
# Opt level: O0

Instruction * __thiscall
spvtools::opt::GraphicsRobustAccessPass::GetValueForType
          (GraphicsRobustAccessPass *this,uint64_t value,Integer *type)

{
  pointer this_00;
  uint32_t uVar1;
  IRContext *pIVar2;
  Constant *c;
  TypeManager *this_01;
  Instruction *pIVar3;
  Constant *constant;
  undefined1 local_40 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> words;
  ConstantManager *mgr;
  Integer *type_local;
  uint64_t value_local;
  GraphicsRobustAccessPass *this_local;
  
  pIVar2 = Pass::context(&this->super_Pass);
  words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)IRContext::get_constant_mgr(pIVar2);
  uVar1 = analysis::Integer::width(type);
  if (uVar1 < 0x41) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
    constant._4_4_ = (undefined4)value;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,
               (value_type_conflict2 *)((long)&constant + 4));
    uVar1 = analysis::Integer::width(type);
    if (0x20 < uVar1) {
      constant._0_4_ = (undefined4)(value >> 0x20);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,
                 (value_type_conflict2 *)&constant);
    }
    c = analysis::ConstantManager::GetConstant
                  ((ConstantManager *)
                   words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,&type->super_Type,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
    this_00 = words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    pIVar2 = Pass::context(&this->super_Pass);
    this_01 = IRContext::get_type_mgr(pIVar2);
    uVar1 = analysis::TypeManager::GetTypeInstruction(this_01,&type->super_Type);
    pIVar3 = analysis::ConstantManager::GetDefiningInstruction
                       ((ConstantManager *)this_00,c,uVar1,(inst_iterator *)0x0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
    return pIVar3;
  }
  __assert_fail("type->width() <= 64",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/graphics_robust_access_pass.cpp"
                ,0x24b,
                "opt::Instruction *spvtools::opt::GraphicsRobustAccessPass::GetValueForType(uint64_t, const analysis::Integer *)"
               );
}

Assistant:

opt::Instruction* opt::GraphicsRobustAccessPass::GetValueForType(
    uint64_t value, const analysis::Integer* type) {
  auto* mgr = context()->get_constant_mgr();
  assert(type->width() <= 64);
  std::vector<uint32_t> words;
  words.push_back(uint32_t(value));
  if (type->width() > 32) {
    words.push_back(uint32_t(value >> 32u));
  }
  const auto* constant = mgr->GetConstant(type, words);
  return mgr->GetDefiningInstruction(
      constant, context()->get_type_mgr()->GetTypeInstruction(type));
}